

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
eastl::vector<eastl::pair<int,_int>,_eastl::allocator>::DoInsertValue
          (vector<eastl::pair<int,_int>,_eastl::allocator> *this,iterator position,value_type *value
          )

{
  pair<int,_int> **pppVar1;
  value_type *pvVar2;
  iterator ppVar3;
  int iVar4;
  pair<int,_int> *ppVar5;
  iterator ppVar6;
  pair<int,_int> *ppVar7;
  pair<int,_int> *ppVar8;
  uint n;
  pair<int,_int> *ppVar9;
  
  pvVar2 = (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpEnd;
  if (pvVar2 == (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpCapacity) {
    iVar4 = (int)((ulong)((long)pvVar2 -
                         (long)(this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).
                               mpBegin) >> 3);
    n = 1;
    if (iVar4 != 0) {
      n = iVar4 * 2;
    }
    ppVar7 = VectorBase<eastl::pair<int,_int>,_eastl::allocator>::DoAllocate
                       (&this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>,n);
    ppVar5 = ppVar7;
    for (ppVar8 = (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpBegin;
        ppVar9 = ppVar5 + 1, ppVar8 != position; ppVar8 = ppVar8 + 1) {
      *ppVar5 = *ppVar8;
      ppVar5 = ppVar9;
    }
    iVar4 = value->second;
    ppVar5->first = value->first;
    ppVar5->second = iVar4;
    ppVar8 = (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpEnd;
    for (; position != ppVar8; position = position + 1) {
      *ppVar9 = *position;
      ppVar9 = ppVar9 + 1;
    }
    ppVar8 = (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpBegin;
    if (ppVar8 != (pair<int,_int> *)0x0) {
      operator_delete__(ppVar8);
    }
    (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpBegin = ppVar7;
    (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpEnd = ppVar9;
    (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpCapacity = ppVar7 + n;
  }
  else {
    *pvVar2 = pvVar2[-1];
    ppVar3 = (this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpEnd;
    while (ppVar6 = ppVar3 + -1, ppVar6 != position) {
      *ppVar6 = ppVar3[-2];
      ppVar3 = ppVar6;
    }
    iVar4 = value[value < pvVar2 && position <= value].second;
    position->first = value[value < pvVar2 && position <= value].first;
    position->second = iVar4;
    pppVar1 = &(this->super_VectorBase<eastl::pair<int,_int>,_eastl::allocator>).mpEnd;
    *pppVar1 = *pppVar1 + 1;
  }
  return;
}

Assistant:

void vector<T, Allocator>::DoInsertValue(iterator position, const value_type& value)
    {
#if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY((position < mpBegin) || (position > mpEnd)))
                EASTL_FAIL_MSG("vector::insert -- invalid position");
#endif

        if(mpEnd != mpCapacity) // If size < capacity ...
        {
            // EASTL_ASSERT(position < mpEnd); // We don't call this function unless position is less than end, and the code directly below relies on this.
            // We need to take into account the possibility that value may come from within the vector itself.
            const T* pValue = &value;
            if((pValue >= position) && (pValue < mpEnd)) // If value comes from within the range to be moved...
                ++pValue;
            ::new(mpEnd) value_type(*(mpEnd - 1));
            eastl::copy_backward(position, mpEnd - 1, mpEnd); // We need copy_backward because of potential overlap issues.
            *position = *pValue;
            ++mpEnd;
        }
        else // else (size == capacity)
        {
            const size_type nPrevSize = size_type(mpEnd - mpBegin);
            const size_type nNewSize  = GetNewCapacity(nPrevSize);
            pointer const   pNewData  = DoAllocate(nNewSize);

#if EASTL_EXCEPTIONS_ENABLED
                pointer pNewEnd = pNewData;
                try
                {
                    pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                    ::new(pNewEnd) value_type(value);
                    pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
                }
                catch(...)
                {
                    DoDestroyValues(pNewData, pNewEnd);
                    DoFree(pNewData, nNewSize);
                    throw;
                }
#else
                pointer pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                ::new(pNewEnd) value_type(value);
                pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
#endif

            DoDestroyValues(mpBegin, mpEnd);
            DoFree(mpBegin, (size_type)(mpCapacity - mpBegin));

            mpBegin    = pNewData;
            mpEnd      = pNewEnd;
            mpCapacity = pNewData + nNewSize;
        }
    }